

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

void __thiscall scriptnum_tests::operators::test_method(operators *this)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  size_t j;
  size_t i;
  long (*in_stack_ffffffffffffff48) [13];
  undefined8 local_a0;
  undefined8 local_98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 0;
  while( true ) {
    sVar2 = std::size<long,13ul>(in_stack_ffffffffffffff48);
    if (sVar2 <= local_98) break;
    local_a0 = 0;
    while( true ) {
      sVar2 = std::size<long,9ul>((long (*) [9])in_stack_ffffffffffffff48);
      if (sVar2 <= local_a0) break;
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa995cc);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa99606);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa99631);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa9966b);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa996b3);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa9970a);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa99752);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa9979d);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa997f6);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa9984f);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa998a8);
      RunOperators(*in_stack_ffffffffffffff48,(int64_t *)0xa99901);
      local_a0 = local_a0 + 1;
    }
    local_98 = local_98 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(operators)
{
    for(size_t i = 0; i < std::size(values); ++i)
    {
        for(size_t j = 0; j < std::size(offsets); ++j)
        {
            RunOperators(values[i], values[i]);
            RunOperators(values[i], -values[i]);
            RunOperators(values[i], values[j]);
            RunOperators(values[i], -values[j]);
            RunOperators(values[i] + values[j], values[j]);
            RunOperators(values[i] + values[j], -values[j]);
            RunOperators(values[i] - values[j], values[j]);
            RunOperators(values[i] - values[j], -values[j]);
            RunOperators(values[i] + values[j], values[i] + values[j]);
            RunOperators(values[i] + values[j], values[i] - values[j]);
            RunOperators(values[i] - values[j], values[i] + values[j]);
            RunOperators(values[i] - values[j], values[i] - values[j]);
        }
    }
}